

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::OperatorIntegerDivideFun::GetFunctions(void)

{
  pointer pSVar1;
  LogicalType varargs;
  FunctionSet<duckdb::ScalarFunction> *pFVar2;
  ScalarFunction *func;
  long lVar3;
  pointer function;
  ScalarFunctionSet *in_RDI;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffcf4;
  undefined4 in_stack_fffffffffffffcfc;
  FunctionNullHandling in_stack_fffffffffffffd08;
  allocator_type local_2f1;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2d8;
  LogicalType local_2c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2a8;
  LogicalType local_290 [2];
  _Any_data local_260;
  code *local_250;
  string local_240;
  LogicalType local_220;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"//","");
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  LogicalType::Numeric();
  if (local_2d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_2d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pFVar2 = &in_RDI->super_FunctionSet<duckdb::ScalarFunction>;
    other = local_2d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start;
    do {
      if (other->id_ != DECIMAL) {
        LogicalType::LogicalType(local_290,other);
        LogicalType::LogicalType(local_290 + 1,other);
        __l._M_len = 2;
        __l._M_array = local_290;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_2a8,__l,&local_2f1);
        LogicalType::LogicalType(&local_2c0,other);
        GetBinaryFunctionIgnoreZero<duckdb::DivideOperator>
                  ((scalar_function_t *)&local_260,other->physical_type_);
        LogicalType::LogicalType(&local_220,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_220;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffcf4;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffcfc;
        ScalarFunction::ScalarFunction
                  (&local_208,(vector<duckdb::LogicalType,_true> *)&local_2a8,&local_2c0,
                   (scalar_function_t *)&local_260,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffd08,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&(pFVar2->functions).
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_208);
        local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_01993078;
        if (local_208.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_208.function.super__Function_base._M_manager)
                    ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,
                     __destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_220);
        if (local_250 != (code *)0x0) {
          (*local_250)(&local_260,&local_260,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_2c0);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_2a8);
        lVar3 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&local_290[0].id_ + lVar3));
          lVar3 = lVar3 + -0x18;
        } while (lVar3 != -0x18);
      }
      other = other + 1;
    } while (other != local_2d8.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d8);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorIntegerDivideFun::GetFunctions() {
	ScalarFunctionSet full_divide("//");
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::DECIMAL) {
			continue;
		} else {
			full_divide.AddFunction(
			    ScalarFunction({type, type}, type, GetBinaryFunctionIgnoreZero<DivideOperator>(type.InternalType())));
		}
	}
	for (auto &func : full_divide.functions) {
		ScalarFunction::SetReturnsError(func);
	}
	return full_divide;
}